

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::GetBitFieldName_abi_cxx11_(int index)

{
  AlphaNum *in_RDI;
  string *varName;
  AlphaNum *this;
  AlphaNum *in_stack_ffffffffffffffb8;
  string local_40 [50];
  allocator local_e;
  undefined1 local_d;
  
  local_d = 0;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"bitField",&local_e);
  std::allocator<char>::~allocator((allocator<char> *)&local_e);
  strings::AlphaNum::AlphaNum(this,(int)((ulong)in_RDI >> 0x20));
  StrCat_abi_cxx11_(in_stack_ffffffffffffffb8);
  std::__cxx11::string::operator+=((string *)this,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::operator+=((string *)this,"_");
  return (string *)in_RDI;
}

Assistant:

std::string GetBitFieldName(int index) {
  std::string varName = "bitField";
  varName += StrCat(index);
  varName += "_";
  return varName;
}